

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void read_ext_tile_info(AV1Decoder *pbi,aom_read_bit_buffer *rb)

{
  uint uVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  int mod;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = *(uint *)(in_RSI + 0x10) & 7;
  if (uVar1 != 0) {
    aom_rb_read_literal((aom_read_bit_buffer *)
                        (CONCAT44(*(uint *)(in_RSI + 0x10),in_stack_ffffffffffffffe0) & 0x7ffffffff)
                        ,in_stack_ffffffffffffffdc);
  }
  if (1 < *(int *)(in_RDI + 0x9c00) * *(int *)(in_RDI + 0x9c04)) {
    iVar2 = aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
    *(int *)(in_RDI + 0x58d9c) = iVar2 + 1;
    iVar2 = aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
    *(int *)(in_RDI + 0x58d98) = iVar2 + 1;
  }
  return;
}

Assistant:

static inline void read_ext_tile_info(AV1Decoder *const pbi,
                                      struct aom_read_bit_buffer *const rb) {
  AV1_COMMON *const cm = &pbi->common;

  // This information is stored as a separate byte.
  int mod = rb->bit_offset % CHAR_BIT;
  if (mod > 0) aom_rb_read_literal(rb, CHAR_BIT - mod);
  assert(rb->bit_offset % CHAR_BIT == 0);

  if (cm->tiles.cols * cm->tiles.rows > 1) {
    // Read the number of bytes used to store tile size
    pbi->tile_col_size_bytes = aom_rb_read_literal(rb, 2) + 1;
    pbi->tile_size_bytes = aom_rb_read_literal(rb, 2) + 1;
  }
}